

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::NameEntry::~NameEntry(NameEntry *this)

{
  ~NameEntry(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~NameEntry() { }